

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpreini.cpp
# Opt level: O0

void vm_run_preinit(CVmFile *origfp,char *image_fname,CVmFile *newfp,CVmHostIfc *hostifc,
                   CVmMainClientIfc *clientifc,char **argv,int argc,
                   CVmRuntimeSymbols *runtime_symtab,CVmRuntimeSymbols *runtime_macros)

{
  int iVar1;
  undefined8 *puVar2;
  long *plVar3;
  CVmImageLoader *pCVar4;
  CVmHostIfc *in_RCX;
  CVmMainClientIfc *in_R8;
  char *in_stack_00000028;
  CVmRuntimeSymbols *in_stack_00000030;
  CVmRuntimeSymbols *in_stack_00000038;
  CVmException *exc;
  char **in_stack_00000048;
  CVmImageLoader *in_stack_00000050;
  long start_pos;
  err_frame_t err_cur__;
  vm_init_options opts;
  CVmImageFile *imagefp;
  CVmImageLoader *loader;
  vm_globals *vmg__;
  ulong in_stack_00000f40;
  CVmFile *in_stack_00000f48;
  CVmFile *in_stack_00000f50;
  long in_stack_00001e98;
  char *in_stack_00001ea0;
  CVmImageFile *in_stack_00001ea8;
  CVmImageLoader *in_stack_00001eb0;
  vm_init_options *in_stack_fffffffffffffe58;
  CVmException *pCVar5;
  CVmImageFileExt *in_stack_fffffffffffffe60;
  undefined8 uVar6;
  CVmException *in_stack_fffffffffffffe98;
  CVmImageLoader *in_stack_fffffffffffffea0;
  uint local_148 [2];
  undefined8 local_140;
  CVmException *local_138;
  CVmImageLoader *in_stack_ffffffffffffff50;
  vm_init_options local_68;
  long *local_48;
  CVmImageLoader *local_40;
  
  local_40 = (CVmImageLoader *)0x0;
  local_48 = (long *)0x0;
  vm_init_options::vm_init_options(&local_68,in_RCX,in_R8,(char *)0x0,(char *)0x0);
  vm_initialize((vm_globals **)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[4])(G_console_X,0);
  puVar2 = (undefined8 *)_ZTW11G_err_frame();
  local_140 = *puVar2;
  plVar3 = (long *)_ZTW11G_err_frame();
  *plVar3 = (long)local_148;
  local_148[0] = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffed0);
  if (local_148[0] == 0) {
    CVmFile::get_pos((CVmFile *)in_stack_fffffffffffffe60);
    plVar3 = (long *)operator_new(0x20);
    CVmImageFileExt::CVmImageFileExt(in_stack_fffffffffffffe60,(CVmFile *)in_stack_fffffffffffffe58)
    ;
    local_48 = plVar3;
    pCVar4 = (CVmImageLoader *)operator_new(0x98);
    CVmImageLoader::CVmImageLoader
              (in_stack_00001eb0,in_stack_00001ea8,in_stack_00001ea0,in_stack_00001e98);
    local_40 = pCVar4;
    CVmImageLoader::load(in_stack_ffffffffffffff50);
    G_preinit_mode_X = 1;
    CVmImageLoader::run(in_stack_00000050,in_stack_00000048,exc._4_4_,in_stack_00000038,
                        in_stack_00000030,in_stack_00000028);
    CVmFile::set_pos((CVmFile *)in_stack_fffffffffffffe60,(long)in_stack_fffffffffffffe58);
    CVmImageLoader::get_static_cs_ofs(local_40);
    vm_rewrite_image(in_stack_00000f50,in_stack_00000f48,in_stack_00000f40);
  }
  if (local_148[0] == 1) {
    local_148[0] = 2;
    in_stack_fffffffffffffe98 = local_138;
    iVar1 = CVmException::get_error_code(local_138);
    if (iVar1 == 0x8fe) {
      err_throw(0);
    }
    err_rethrow();
  }
  if ((local_148[0] & 0x8000) == 0) {
    local_148[0] = local_148[0] | 0x8000;
    if (local_40 != (CVmImageLoader *)0x0) {
      CVmImageLoader::unload((CVmImageLoader *)0x22cef8);
    }
    pCVar4 = local_40;
    if ((local_40 != (CVmImageLoader *)0x0) && (local_40 != (CVmImageLoader *)0x0)) {
      CVmImageLoader::~CVmImageLoader(in_stack_fffffffffffffea0);
      operator_delete(pCVar4,0x98);
    }
    if ((local_48 != (long *)0x0) && (local_48 != (long *)0x0)) {
      (**(code **)(*local_48 + 8))();
    }
    vm_terminate((vm_globals *)in_stack_fffffffffffffea0,
                 (CVmMainClientIfc *)in_stack_fffffffffffffe98);
  }
  uVar6 = local_140;
  puVar2 = (undefined8 *)_ZTW11G_err_frame();
  *puVar2 = uVar6;
  if ((local_148[0] & 0x4001) != 0) {
    puVar2 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar2 & 2) != 0) {
      plVar3 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar3 + 0x10));
    }
    pCVar5 = local_138;
    plVar3 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar3 + 0x10) = pCVar5;
    err_rethrow();
  }
  if ((local_148[0] & 2) != 0) {
    free(local_138);
  }
  return;
}

Assistant:

void vm_run_preinit(CVmFile *origfp, const char *image_fname,
                    CVmFile *newfp, class CVmHostIfc *hostifc,
                    class CVmMainClientIfc *clientifc, 
                    const char *const *argv, int argc,
                    class CVmRuntimeSymbols *runtime_symtab,
                    class CVmRuntimeSymbols *runtime_macros)
{
    vm_globals *vmg__;
    CVmImageLoader *volatile loader = 0;
    CVmImageFile *volatile imagefp = 0;

    /* initialize the VM */
    vm_init_options opts(hostifc, clientifc);
    vm_initialize(&vmg__, &opts);

    /* 
     *   turn off "more" on the console - when running preinitialization,
     *   any output is purely diagnostic information for the programmer
     *   and thus should be formatted as simple stdio-style console output 
     */
    G_console->set_more_state(FALSE);

    err_try
    {
        /* note where the image file starts */
        long start_pos = origfp->get_pos();
        
        /* create the loader */
        imagefp = new CVmImageFileExt(origfp);
        loader = new CVmImageLoader(imagefp, image_fname, 0);

        /* load the image */
        loader->load(vmg0_);

        /* set pre-init mode */
        G_preinit_mode = TRUE;

        /* run it, using the runtime symbols the caller sent us */
        loader->run(vmg_ argv, argc, runtime_symtab, runtime_macros, 0);

        /* 
         *   seek back to the start of the image file, since we need to
         *   copy parts of the original file to the new file 
         */
        origfp->set_pos(start_pos);

        /* save the new image file */
        vm_rewrite_image(vmg_ origfp, newfp, loader->get_static_cs_ofs());
    }